

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::BitfieldInsertCase::getInputValues
          (BitfieldInsertCase *this,int numValues,void **values)

{
  ShaderType shaderType;
  Precision dataType;
  int iVar1;
  pointer pSVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  deUint32 dVar7;
  int in_R9D;
  ulong uVar8;
  uint uVar9;
  Random rnd;
  deRandom local_40;
  
  dVar7 = deStringHash((this->super_IntegerFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&local_40,dVar7 ^ 0x12c2acff);
  pSVar2 = (this->super_IntegerFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  shaderType = (pSVar2->varType).m_data.basic.type;
  dataType = (pSVar2->varType).m_data.basic.precision;
  pvVar3 = *values;
  pvVar4 = values[1];
  if (0 < numValues) {
    pvVar5 = values[2];
    pvVar6 = values[3];
    iVar1 = *(int *)(&DAT_00987a80 + (ulong)dataType * 4);
    uVar8 = 0;
    do {
      dVar7 = deRandom_getUint32(&local_40);
      uVar9 = dVar7 % (iVar1 + 1U);
      dVar7 = deRandom_getUint32(&local_40);
      *(uint *)((long)pvVar5 + uVar8 * 4) = dVar7 % ((iVar1 + 1U) - uVar9);
      *(uint *)((long)pvVar6 + uVar8 * 4) = uVar9;
      uVar8 = uVar8 + 1;
    } while ((uint)numValues != uVar8);
  }
  anon_unknown_3::generateRandomInputData
            ((Random *)&local_40,shaderType,dataType,(Precision)pvVar3,
             (deUint32 *)(ulong)(uint)numValues,in_R9D);
  anon_unknown_3::generateRandomInputData
            ((Random *)&local_40,shaderType,dataType,(Precision)pvVar4,
             (deUint32 *)(ulong)(uint)numValues,in_R9D);
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		de::Random				rnd			(deStringHash(getName()) ^ 0x12c2acff);
		const glu::DataType		type		= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision	= m_spec.inputs[0].varType.getPrecision();
		const int				numBits		= getShaderUintBitCount(m_shaderType, precision);
		deUint32*				inBase		= (deUint32*)values[0];
		deUint32*				inInsert	= (deUint32*)values[1];
		int*					inOffset	= (int*)values[2];
		int*					inBits		= (int*)values[3];

		for (int valueNdx = 0; valueNdx < numValues; ++valueNdx)
		{
			const int bits		= rnd.getInt(0, numBits);
			const int offset	= rnd.getInt(0, numBits-bits);

			inOffset[valueNdx]	= offset;
			inBits[valueNdx]	= bits;
		}

		generateRandomInputData(rnd, m_shaderType, type, precision, inBase, numValues);
		generateRandomInputData(rnd, m_shaderType, type, precision, inInsert, numValues);
	}